

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetBufferi(void)

{
  uint32 name_00;
  ALenum param_00;
  int32 value_00;
  ALint *origvalue_00;
  ALint value;
  ALint *origvalue;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    origvalue_00 = (ALint *)IO_PTR();
    value_00 = IO_INT32();
    if (io_failure == 0) {
      visit_alGetBufferi((CallerInfo *)&param,name_00,param_00,origvalue_00,value_00);
    }
  }
  return;
}

Assistant:

static void decode_alGetBufferi(void)
{
    IO_START(alGetBufferi);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    ALint *origvalue = (ALint *) IO_PTR();
    const ALint value = IO_INT32();
    if (!io_failure) visit_alGetBufferi(&callerinfo, name, param, origvalue, value);
    IO_END();
}